

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readDistribution.hpp
# Opt level: O1

Distribution * __thiscall
njoy::ENDFtk::section::Type<6>::ReactionProduct::
readDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Distribution *__return_storage_ptr__,ReactionProduct *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LAW,long lineLaw)

{
  undefined8 *puVar1;
  char *args;
  int MAT_00;
  undefined4 in_stack_0000001c;
  LaboratoryAngleEnergy local_98;
  
  MAT_00 = (int)lineNumber;
  switch(MT) {
  case 0:
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x01';
    return __return_storage_ptr__;
  case 1:
    ContinuumEnergyAngle::
    ContinuumEnergyAngle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ContinuumEnergyAngle *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_u = local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 8) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x10) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x18) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x20) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x28) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x30) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x38) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x40) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x48) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x50) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x58) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x60) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x68) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x70) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x02';
    std::
    vector<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
    ::~vector((vector<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
               *)&local_98.data_.sequence_);
    break;
  case 2:
    DiscreteTwoBodyScattering::
    DiscreteTwoBodyScattering<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((DiscreteTwoBodyScattering *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_u = local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 8) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x10) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x18) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x20) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x28) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x30) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x38) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x40) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x48) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x50) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x58) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x60) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x68) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x70) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x03';
    std::
    vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
    ::~vector((vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
               *)&local_98.data_.sequence_);
    break;
  case 3:
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x04';
    return __return_storage_ptr__;
  case 4:
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x05';
    return __return_storage_ptr__;
  case 5:
    ChargedParticleElasticScattering::
    ChargedParticleElasticScattering<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((ChargedParticleElasticScattering *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_u = local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 8) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x10) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x18) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x20) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x28) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x30) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x38) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x40) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x48) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x50) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x58) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x60) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x68) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x70) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\x06';
    std::
    vector<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>_>_>
    ::~vector((vector<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearAmplitudeExpansion,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering::NuclearPlusInterference>_>_>
               *)&local_98.data_.sequence_);
    break;
  case 6:
    NBodyPhaseSpace::NBodyPhaseSpace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((NBodyPhaseSpace *)&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_u = local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 8) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x10) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x18) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x20) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x28) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\a';
    return __return_storage_ptr__;
  case 7:
    LaboratoryAngleEnergy::
    LaboratoryAngleEnergy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_98,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_u = local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 8) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x10) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     ._M_u + 0x18) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x20) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x28) =
         local_98.data_.interpolation_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x30) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x38) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x40) =
         local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x48) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x50) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x58) =
         local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x60) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x68) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
             ._M_u + 0x70) =
         local_98.data_.sequence_.
         super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.data_.sequence_.
    super__Vector_base<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
    ._M_index = '\b';
    std::
    vector<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution,_std::allocator<njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy::AngularDistribution>_>
    ::~vector(&local_98.data_.sequence_);
    break;
  case -0xf:
  case -0xe:
  case -5:
  case -4:
    if (MF == 0x12) {
      DefinedElsewhere::checkLAW(MT);
      *(int *)&(__return_storage_ptr__->
               super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               ).
               super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               .
               super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
               ._M_u = MT;
      (__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
      ._M_index = '\0';
      return __return_storage_ptr__;
    }
    tools::Log::error<char_const*>("Encountered illegal LAW value for non fission reaction");
    tools::Log::info<char_const*>("LAW can only be negative for MT=18");
    args = "MT value: {}";
    MT = MF;
    goto LAB_001500b7;
  default:
    tools::Log::error<char_const*>("Encountered illegal LAW value");
    tools::Log::info<char_const*>("LAW is negative or equal to a value between 0 and 7");
    args = "LAW value: {}";
LAB_001500b7:
    tools::Log::info<char_const*,int>(args,MT);
    tools::Log::info<char_const*,long>("Line number: {}",CONCAT44(in_stack_0000001c,LAW) + -1);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  if (local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_98.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices
                    .super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                    ._M_start,
                    (long)local_98.data_.interpolation_.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.data_.interpolation_.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_98.data_.interpolation_.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_98.data_.interpolation_.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_98.data_.interpolation_.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static Distribution
readDistribution( Iterator& begin,
                  const Iterator& end,
                  long& lineNumber,
                  int MAT,
                  int MF,
                  int MT,
                  int LAW,
                  long lineLaw ) {
  switch ( LAW ) {
    case  -4 :
    case  -5 :
    case -14 :
    case -15 : {
      if ( MT != 18 ) {
        Log::error( "Encountered illegal LAW value for non fission reaction" );
        Log::info( "LAW can only be negative for MT=18" );
        Log::info( "MT value: {}", MT );
        Log::info( "Line number: {}", lineLaw - 1 );
        throw std::exception();
      }
      return DefinedElsewhere( LAW );
    }
    case   0 : return Unknown();
    case   1 : return ContinuumEnergyAngle(
                        begin, end, lineNumber, MAT, MF, MT );
    case   2 : return DiscreteTwoBodyScattering(
                        begin, end, lineNumber, MAT, MF, MT );
    case   3 : return IsotropicDiscreteEmission();
    case   4 : return DiscreteTwoBodyRecoils();
    case   5 : return ChargedParticleElasticScattering(
                        begin, end, lineNumber, MAT, MF, MT );
    case   6 : return NBodyPhaseSpace( begin, end, lineNumber, MAT, MF, MT );
    case   7 : return LaboratoryAngleEnergy(
                        begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LAW value" );
      Log::info( "LAW is negative or equal to a value between 0 and 7" );
      Log::info( "LAW value: {}", LAW );
      Log::info( "Line number: {}", lineLaw - 1 );
      throw std::exception();
    }
  }
}